

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O0

void __thiscall
wasm::OptimizeInstructions::visitGlobalSet(OptimizeInstructions *this,GlobalSet *curr)

{
  bool bVar1;
  GlobalGet *pGVar2;
  GlobalGet *get;
  GlobalSet *local_18;
  GlobalSet *curr_local;
  OptimizeInstructions *this_local;
  
  get._4_4_ = 1;
  local_18 = curr;
  curr_local = (GlobalSet *)this;
  bVar1 = wasm::Type::operator==
                    (&(curr->super_SpecificExpression<(wasm::Expression::Id)11>).super_Expression.
                      type,(BasicType *)((long)&get + 4));
  if (((!bVar1) &&
      (pGVar2 = Expression::dynCast<wasm::GlobalGet>(local_18->value), pGVar2 != (GlobalGet *)0x0))
     && (bVar1 = IString::operator==(&(pGVar2->name).super_IString,&(local_18->name).super_IString),
        bVar1)) {
    ExpressionManipulator::nop<wasm::GlobalSet>(local_18);
    replaceCurrent(this,(Expression *)local_18);
  }
  return;
}

Assistant:

void visitGlobalSet(GlobalSet* curr) {
    if (curr->type == Type::unreachable) {
      return;
    }
    // optimize out a set of a get
    auto* get = curr->value->dynCast<GlobalGet>();
    if (get && get->name == curr->name) {
      ExpressionManipulator::nop(curr);
      return replaceCurrent(curr);
    }
  }